

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O3

pair<tyti::stl::basic_solid<double>,_bool> *
tyti::stl::read<double>
          (pair<tyti::stl::basic_solid<double>,_bool> *__return_storage_ptr__,string *fileName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool r;
  basic_solid<double> out;
  bool local_81;
  basic_solid<double> local_80;
  
  paVar1 = &local_80.header.field_2;
  local_80.header._M_string_length = 0;
  local_80.header.field_2._M_local_buf[0] = '\0';
  local_80.normals.
  super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.normals.
  super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.normals.
  super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.vertices.
  super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.vertices.
  super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.vertices.
  super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.attributes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.attributes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.attributes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.header._M_dataplus._M_p = (pointer)paVar1;
  local_81 = read<double>(&local_80,fileName);
  std::pair<tyti::stl::basic_solid<double>,_bool>::pair<tyti::stl::basic_solid<double>,_bool,_true>
            (__return_storage_ptr__,&local_80,&local_81);
  if (local_80.attributes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.attributes.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.attributes.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.attributes.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.vertices.
      super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.vertices.
                    super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.vertices.
                          super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.vertices.
                          super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.normals.
      super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.normals.
                    super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.normals.
                          super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.normals.
                          super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.header._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.header._M_dataplus._M_p,
                    CONCAT71(local_80.header.field_2._M_allocated_capacity._1_7_,
                             local_80.header.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<basic_solid<T>, bool> read(const std::string& fileName)
        {
            basic_solid<T> out;
            bool r = read(out, fileName);
            return std::make_pair<basic_solid<T>, bool>(std::move(out), std::move(r));
        }